

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  int iVar1;
  void *pvVar2;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  undefined8 *in_R8;
  int i_1;
  int c;
  int idxA;
  int idxB;
  int idxG;
  int idxR;
  int ret_1;
  int i;
  int ret;
  EXRImage exrImage;
  int local_10bc;
  int local_10b8;
  int local_10b4;
  int local_10b0;
  int local_10ac;
  int local_10a8;
  int local_10a0;
  char **in_stack_ffffffffffffefb8;
  uchar *in_stack_ffffffffffffefc0;
  EXRImage *in_stack_ffffffffffffefc8;
  int local_94;
  char **local_90;
  uchar **local_88;
  int *local_80;
  int *local_78;
  int local_70;
  int local_6c;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "Invalid argument.\n";
    }
    local_4 = -1;
  }
  else {
    InitEXRImage((EXRImage *)&stack0xffffffffffffef68);
    local_4 = ParseMultiChannelEXRHeaderFromFile
                        (in_stack_ffffffffffffefc8,(char *)in_stack_ffffffffffffefc0,
                         in_stack_ffffffffffffefb8);
    if (local_4 == 0) {
      for (local_10a0 = 0; local_10a0 < local_94; local_10a0 = local_10a0 + 1) {
        if (local_80[local_10a0] == 1) {
          local_78[local_10a0] = 2;
        }
      }
      local_4 = LoadMultiChannelEXRFromFile
                          (in_stack_ffffffffffffefc8,(char *)in_stack_ffffffffffffefc0,
                           in_stack_ffffffffffffefb8);
      if (local_4 == 0) {
        local_10a8 = -1;
        local_10ac = -1;
        local_10b0 = -1;
        local_10b4 = -1;
        for (local_10b8 = 0; local_10b8 < local_94; local_10b8 = local_10b8 + 1) {
          iVar1 = strcmp(local_90[local_10b8],"R");
          if (iVar1 == 0) {
            local_10a8 = local_10b8;
          }
          else {
            iVar1 = strcmp(local_90[local_10b8],"G");
            if (iVar1 == 0) {
              local_10ac = local_10b8;
            }
            else {
              iVar1 = strcmp(local_90[local_10b8],"B");
              if (iVar1 == 0) {
                local_10b0 = local_10b8;
              }
              else {
                iVar1 = strcmp(local_90[local_10b8],"A");
                if (iVar1 == 0) {
                  local_10b4 = local_10b8;
                }
              }
            }
          }
        }
        if (local_10a8 == -1) {
          if (in_R8 != (undefined8 *)0x0) {
            *in_R8 = "R channel not found\n";
          }
          local_4 = -1;
        }
        else if (local_10ac == -1) {
          if (in_R8 != (undefined8 *)0x0) {
            *in_R8 = "G channel not found\n";
          }
          local_4 = -1;
        }
        else if (local_10b0 == -1) {
          if (in_R8 != (undefined8 *)0x0) {
            *in_R8 = "B channel not found\n";
          }
          local_4 = -1;
        }
        else {
          pvVar2 = malloc((long)local_70 * 0x10 * (long)local_6c);
          *in_RDI = (long)pvVar2;
          for (local_10bc = 0; local_10bc < local_70 * local_6c; local_10bc = local_10bc + 1) {
            *(undefined4 *)(*in_RDI + (long)(local_10bc << 2) * 4) =
                 *(undefined4 *)(local_88[local_10a8] + (long)local_10bc * 4);
            *(undefined4 *)(*in_RDI + (long)(local_10bc * 4 + 1) * 4) =
                 *(undefined4 *)(local_88[local_10ac] + (long)local_10bc * 4);
            *(undefined4 *)(*in_RDI + (long)(local_10bc * 4 + 2) * 4) =
                 *(undefined4 *)(local_88[local_10b0] + (long)local_10bc * 4);
            if (local_10b4 < 1) {
              *(undefined4 *)(*in_RDI + (long)(local_10bc * 4 + 3) * 4) = 0x3f800000;
            }
            else {
              *(undefined4 *)(*in_RDI + (long)(local_10bc * 4 + 3) * 4) =
                   *(undefined4 *)(local_88[local_10b4] + (long)local_10bc * 4);
            }
          }
          *in_RSI = local_70;
          *in_RDX = local_6c;
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {

  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return -1;
  }

  EXRImage exrImage;
  InitEXRImage(&exrImage);

  {
    int ret = ParseMultiChannelEXRHeaderFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exrImage.num_channels; i++) {
    if (exrImage.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exrImage.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadMultiChannelEXRFromFile(&exrImage, filename, err);
    if (ret != 0) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exrImage.num_channels; c++) {
    if (strcmp(exrImage.channel_names[c], "R") == 0) {
      idxR = c;
    } else if (strcmp(exrImage.channel_names[c], "G") == 0) {
      idxG = c;
    } else if (strcmp(exrImage.channel_names[c], "B") == 0) {
      idxB = c;
    } else if (strcmp(exrImage.channel_names[c], "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exrImage }
    return -1;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exrImage }
    return -1;
  }

  (*out_rgba) =
      (float *)malloc(4 * sizeof(float) * exrImage.width * exrImage.height);
  for (int i = 0; i < exrImage.width * exrImage.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exrImage.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exrImage.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exrImage.images)[idxB][i];
    if (idxA > 0) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exrImage.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exrImage.width;
  (*height) = exrImage.height;

  // @todo { free exrImage }
  return 0;
}